

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O3

void __thiscall CVmObjIterIdx::get_indexed_val(CVmObjIterIdx *this,long idx,vm_val_t *retval)

{
  char *pcVar1;
  vm_val_t coll;
  vm_val_t idx_val;
  vm_val_t local_38;
  vm_val_t local_28;
  
  pcVar1 = (this->super_CVmObjIter).super_CVmObject.ext_;
  local_38.typ = (vm_datatype_t)*pcVar1;
  vmb_get_dh_val(pcVar1,&local_38);
  if (local_38.typ == VM_OBJ) {
    local_28.typ = VM_INT;
    local_28.val.obj = (uint)idx;
    CVmObject::index_val_ov
              ((CVmObject *)
               ((long)&G_obj_table_X.pages_[local_38.val.obj >> 0xc]->ptr_ +
               (ulong)((local_38.val.obj & 0xfff) * 0x18)),retval,local_38.val.obj,&local_28);
  }
  else {
    if (local_38.typ != VM_LIST) {
      err_throw(0x7de);
    }
    pcVar1 = vm_val_t::get_as_list(&local_38);
    CVmObjList::index_list(retval,pcVar1,(uint)idx);
  }
  return;
}

Assistant:

void CVmObjIterIdx::get_indexed_val(VMG_ long idx, vm_val_t *retval)
{
    vm_val_t coll;
    vm_val_t idx_val;

    /* get my collection value and the next index value */
    get_coll_val(&coll);

    /* check to see if we have an object or a constant list */
    switch(coll.typ)
    {
    case VM_LIST:
        /* it's a constant list - index the constant value */
        CVmObjList::index_list(vmg_ retval, coll.get_as_list(vmg0_), idx);
        break;

    case VM_OBJ:
        /* it's an object - index it */
        idx_val.set_int(idx);
        vm_objp(vmg_ coll.val.obj)
            ->index_val_ov(vmg_ retval, coll.val.obj, &idx_val);
        break;

    default:
        /* 
         *   Anything else is an error.  We really should never be able to
         *   get here, since the only way to instantiate an iterator should
         *   be via the collection object's createIter() method; so if we
         *   get here it must be an internal error, hence we could probably
         *   assert failure here.  Nonetheless, just throw an error, since
         *   this will make for a more pleasant indication of the problem.  
         */
        err_throw(VMERR_CANNOT_INDEX_TYPE);
        break;
    }
}